

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

PhysicalDevice * __thiscall
vkb::PhysicalDeviceSelector::populate_device_details
          (PhysicalDevice *__return_storage_ptr__,PhysicalDeviceSelector *this,
          VkPhysicalDevice vk_phys_device,GenericFeatureChain *src_extended_features_chain)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pGVar3;
  pointer pGVar4;
  pointer pVVar5;
  PhysicalDeviceSelector *pPVar6;
  pointer pGVar7;
  VkResult VVar8;
  GenericFeaturesPNextNode *extension;
  size_t sVar9;
  undefined8 *puVar10;
  pointer pGVar11;
  char *pcVar12;
  iterator __end2;
  pointer __s;
  pointer pGVar13;
  GenericFeatureChain fill_chain;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> available_extensions;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_families;
  VkPhysicalDeviceFeatures2 local_features;
  VkPhysicalDevice local_188;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_180;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_168;
  PhysicalDeviceSelector *local_148;
  GenericFeatureChain *local_140;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [7];
  
  local_188 = vk_phys_device;
  local_140 = src_extended_features_chain;
  memset(__return_storage_ptr__,0,0x6c0);
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  memset(&__return_storage_ptr__->physical_device,0,0xec);
  memset(&__return_storage_ptr__->properties,0,0x124);
  memset(&(__return_storage_ptr__->properties).limits,0,0x20c);
  memset(&__return_storage_ptr__->memory_properties,0,0x208);
  __return_storage_ptr__->instance_version = 0x400000;
  __return_storage_ptr__->suitable = yes;
  (__return_storage_ptr__->extensions_to_enable).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extensions_to_enable).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->extensions_to_enable).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->available_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->available_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->available_extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->queue_families).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->queue_families).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->queue_families).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->extended_features_chain).nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extended_features_chain).nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->extended_features_chain).nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->defer_surface_initialization = false;
  __return_storage_ptr__->properties2_ext_enabled = false;
  __return_storage_ptr__->physical_device = vk_phys_device;
  __return_storage_ptr__->surface = (this->instance_info).surface;
  __return_storage_ptr__->defer_surface_initialization =
       (this->criteria).defer_surface_initialization;
  __return_storage_ptr__->instance_version = (this->instance_info).version;
  detail::
  get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*&>
            (&local_138,(detail *)(detail::vulkan_functions()::v + 0xa0),
             (_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)&local_188,
             (VkPhysicalDevice_T **)src_extended_features_chain);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
            (&__return_storage_ptr__->queue_families,&local_138);
  (*(code *)detail::vulkan_functions()::v._152_8_)(local_188,&__return_storage_ptr__->properties);
  (*(code *)detail::vulkan_functions()::v._128_8_)(local_188,&__return_storage_ptr__->features);
  (*(code *)detail::vulkan_functions()::v._168_8_)(local_188);
  pcVar12 = (__return_storage_ptr__->properties).deviceName;
  pcVar2 = (char *)(__return_storage_ptr__->name)._M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar12);
  local_168.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120[0]._M_dataplus._M_p = (pointer)0x0;
  VVar8 = detail::
          get_vector<VkExtensionProperties,VkResult(*&)(VkPhysicalDevice_T*,char_const*,unsigned_int*,VkExtensionProperties*),VkPhysicalDevice_T*&,decltype(nullptr)>
                    (&local_168,
                     (_func_VkResult_VkPhysicalDevice_T_ptr_char_ptr_uint_ptr_VkExtensionProperties_ptr
                      **)(detail::vulkan_functions()::v + 0xb0),&local_188,(void **)local_120);
  pVVar5 = local_168.
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (VVar8 != VK_SUCCESS) goto LAB_001067fa;
  local_148 = this;
  if (local_168.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_168.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_120[0].field_2;
    __s = local_168.
          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      local_120[0]._M_dataplus._M_p = (pointer)paVar1;
      if (__s == (pointer)0x0) {
        pcVar12 = (char *)0x1;
      }
      else {
        sVar9 = strlen(__s->extensionName);
        pcVar12 = __s->extensionName + sVar9;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,__s,pcVar12);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->available_extensions,local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_120[0]._M_dataplus._M_p,local_120[0].field_2._M_allocated_capacity + 1
                       );
      }
      __s = __s + 1;
    } while (__s != pVVar5);
  }
  pPVar6 = local_148;
  __return_storage_ptr__->properties2_ext_enabled =
       (local_148->instance_info).properties2_ext_enabled;
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::vector(&local_180,&local_140->nodes);
  pGVar4 = local_180.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar3 = local_180.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_180.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((pPVar6->instance_info).version < 0x401000) {
      if ((pPVar6->instance_info).properties2_ext_enabled != true) goto LAB_001067e3;
      memset(local_120,0,0xf0);
      pGVar7 = pGVar3;
      pGVar13 = (pointer)0x0;
      do {
        pGVar11 = pGVar7;
        if (pGVar13 != (pointer)0x0) {
          pGVar13->pNext = pGVar11;
        }
        pGVar7 = pGVar11 + 1;
        pGVar13 = pGVar11;
      } while (pGVar11 + 1 != pGVar4);
      local_120[0]._M_string_length = (size_type)(pointer)0x0;
      if (pGVar3 != local_180.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_120[0]._M_string_length = (size_type)pGVar3;
      }
      puVar10 = (undefined8 *)(detail::vulkan_functions()::v + 0x90);
    }
    else {
      memset(local_120,0,0xf0);
      pGVar7 = pGVar3;
      pGVar13 = (pointer)0x0;
      do {
        pGVar11 = pGVar7;
        if (pGVar13 != (pointer)0x0) {
          pGVar13->pNext = pGVar11;
        }
        pGVar7 = pGVar11 + 1;
        pGVar13 = pGVar11;
      } while (pGVar11 + 1 != pGVar4);
      local_120[0]._M_string_length = (size_type)(pointer)0x0;
      if (pGVar3 != local_180.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_120[0]._M_string_length = (size_type)pGVar3;
      }
      puVar10 = (undefined8 *)(detail::vulkan_functions()::v + 0x88);
    }
    local_120[0]._M_dataplus._M_p._0_4_ = 0x3b9bb078;
    (*(code *)*puVar10)(local_188,local_120);
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::operator=(&(__return_storage_ptr__->extended_features_chain).nodes,&local_180);
  }
LAB_001067e3:
  if (local_180.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_001067fa:
  if (local_168.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

PhysicalDevice PhysicalDeviceSelector::populate_device_details(
    VkPhysicalDevice vk_phys_device, detail::GenericFeatureChain const& src_extended_features_chain) const {
    PhysicalDevice physical_device{};
    physical_device.physical_device = vk_phys_device;
    physical_device.surface = instance_info.surface;
    physical_device.defer_surface_initialization = criteria.defer_surface_initialization;
    physical_device.instance_version = instance_info.version;
    auto queue_families = detail::get_vector_noerror<VkQueueFamilyProperties>(
        detail::vulkan_functions().fp_vkGetPhysicalDeviceQueueFamilyProperties, vk_phys_device);
    physical_device.queue_families = queue_families;

    detail::vulkan_functions().fp_vkGetPhysicalDeviceProperties(vk_phys_device, &physical_device.properties);
    detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures(vk_phys_device, &physical_device.features);
    detail::vulkan_functions().fp_vkGetPhysicalDeviceMemoryProperties(vk_phys_device, &physical_device.memory_properties);

    physical_device.name = physical_device.properties.deviceName;

    std::vector<VkExtensionProperties> available_extensions;
    auto available_extensions_ret = detail::get_vector<VkExtensionProperties>(
        available_extensions, detail::vulkan_functions().fp_vkEnumerateDeviceExtensionProperties, vk_phys_device, nullptr);
    if (available_extensions_ret != VK_SUCCESS) return physical_device;
    for (const auto& ext : available_extensions) {
        physical_device.available_extensions.push_back(&ext.extensionName[0]);
    }

    physical_device.properties2_ext_enabled = instance_info.properties2_ext_enabled;

    auto fill_chain = src_extended_features_chain;

    bool instance_is_1_1 = instance_info.version >= VKB_VK_API_VERSION_1_1;
    if (!fill_chain.nodes.empty() && (instance_is_1_1 || instance_info.properties2_ext_enabled)) {
        VkPhysicalDeviceFeatures2 local_features{};
        fill_chain.chain_up(local_features);
        // Use KHR function if not able to use the core function
        if (instance_is_1_1) {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2(vk_phys_device, &local_features);
        } else {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2KHR(vk_phys_device, &local_features);
        }
        physical_device.extended_features_chain = fill_chain;
    }

    return physical_device;
}